

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RepeatLoopInst::Exec
          (RepeatLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int iVar1;
  undefined4 uVar2;
  Label LVar3;
  CharCount CVar4;
  PageAllocation *pPVar5;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  size_t sVar10;
  Program *pPVar11;
  ulong uVar12;
  int i;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ArenaAllocator *alloc;
  LoopInfo *pLVar16;
  
  uVar14 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  pPVar11 = (matcher->program).ptr;
  if ((ulong)(pPVar11->rep).insts.instsLen < uVar14 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar7) goto LAB_00ef7e30;
    *puVar9 = 0;
    pPVar11 = (matcher->program).ptr;
  }
  lVar15 = *(long *)&pPVar11->rep;
  if (*(char *)(lVar15 + uVar14) != 'D') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar7) goto LAB_00ef7e30;
    *puVar9 = 0;
    pPVar11 = (matcher->program).ptr;
    lVar15 = *(long *)&pPVar11->rep;
  }
  iVar1 = *(int *)(lVar15 + 1 + uVar14);
  if (((long)iVar1 < 0) || (pPVar11->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar7) goto LAB_00ef7e30;
    *puVar9 = 0;
  }
  pLVar16 = (matcher->loopInfos).ptr + iVar1;
  if (*(char *)(lVar15 + 0xe + uVar14) == '\x01') {
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar10 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
      sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef7e30;
      *puVar9 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x28;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar10) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    uVar2 = *(undefined4 *)(lVar15 + 1 + uVar14);
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar10) = 1;
    *(undefined ***)((long)&pPVar5[1].segment + sVar10) = &PTR_Print_01543488;
    *(undefined4 *)((long)&pPVar5[2].pageCount + sVar10 + 4) = uVar2;
    *(undefined8 *)((long)&pPVar5[2].segment + sVar10) = *(undefined8 *)pLVar16;
    *(undefined8 *)((long)&pPVar5[3].pageCount + sVar10) = 0;
    if (pLVar16->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014d5058;
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar5[3].pageCount + sVar10) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar16->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar8 = pLVar16->number + 1;
  pLVar16->number = uVar8;
  uVar13 = *(uint *)(lVar15 + 5 + uVar14);
  if (uVar8 < uVar13) {
    pLVar16->startInputOffset = *inputOffset;
    if (*(char *)(lVar15 + 0xe + uVar14) == '\x01') {
      iVar1 = *(int *)(lVar15 + 0x17 + uVar14);
      if (-1 < iVar1) {
        Matcher::DoSaveInnerGroups
                  (matcher,*(int *)(lVar15 + 0x13 + uVar14),iVar1,true,input,contStack);
      }
    }
    else {
      uVar13 = *(uint *)(lVar15 + 0x13 + uVar14);
      iVar1 = *(int *)(lVar15 + 0x17 + uVar14);
      if ((int)uVar13 <= iVar1) {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          if (((int)uVar13 < 0) || (((matcher->program).ptr)->numGroups <= uVar13)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                               ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                               "groupId >= 0 && groupId < program->numGroups");
            if (!bVar7) goto LAB_00ef7e30;
            *puVar9 = 0;
          }
          (matcher->groupInfos).ptr[(int)uVar13].length = 0xffffffff;
          uVar13 = uVar13 + 1;
        } while ((int)uVar13 <= iVar1);
      }
    }
    LVar3 = (this->super_RepeatLoopMixin).beginLabel;
    pPVar11 = (matcher->program).ptr;
  }
  else {
    if ((uVar13 < uVar8) && (*inputOffset == pLVar16->startInputOffset)) {
      bVar7 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar7;
    }
    uVar13 = *(uint *)(lVar15 + 9 + uVar14);
    if ((uVar13 != 0xffffffff) && (uVar13 <= uVar8)) {
      uVar13 = *(uint *)(lVar15 + 0xf + uVar14);
      pPVar11 = (matcher->program).ptr;
      if ((pPVar11->rep).insts.instsLen <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x76d,"(label < program->rep.insts.instsLen)",
                           "label < program->rep.insts.instsLen");
        if (!bVar7) goto LAB_00ef7e30;
        *puVar9 = 0;
        pPVar11 = (matcher->program).ptr;
      }
      *instPointer = (pPVar11->rep).insts.insts.ptr + uVar13;
      return false;
    }
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    uVar12 = sVar10 - (contStack->
                      super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                      super_ContinuousPageStack<1UL>.nextTop;
    if (*(char *)(lVar15 + 0x1b + uVar14) != '\x01') {
      if (uVar12 < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.bufferSize;
      }
      if (sVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar7) goto LAB_00ef7e30;
        *puVar9 = 0;
      }
      pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x20;
      *(size_t *)((long)&pPVar5[1].pageCount + sVar10) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      LVar3 = (this->super_RepeatLoopMixin).beginLabel;
      CVar4 = *inputOffset;
      *(undefined1 *)((long)&pPVar5[2].pageCount + sVar10) = 5;
      *(undefined ***)((long)&pPVar5[1].segment + sVar10) = &PTR_Print_01543368;
      *(Label *)((long)&pPVar5[2].pageCount + sVar10 + 4) = LVar3;
      *(CharCount *)((long)&pPVar5[2].segment + sVar10) = CVar4;
      Matcher::PushStats(matcher,contStack,input);
      uVar13 = *(uint *)(lVar15 + 0xf + uVar14);
      pPVar11 = (matcher->program).ptr;
      if ((pPVar11->rep).insts.instsLen <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x76d,"(label < program->rep.insts.instsLen)",
                           "label < program->rep.insts.instsLen");
        if (!bVar7) goto LAB_00ef7e30;
        *puVar9 = 0;
        pPVar11 = (matcher->program).ptr;
      }
      *instPointer = (pPVar11->rep).insts.insts.ptr + uVar13;
      return false;
    }
    if (uVar12 < 0x20) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef7e30;
      *puVar9 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x20;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar10) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x20;
    CVar4 = *inputOffset;
    uVar2 = *(undefined4 *)(lVar15 + 0xf + uVar14);
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar10) = 0;
    *(undefined ***)((long)&pPVar5[1].segment + sVar10) = &PTR_Print_015432a8;
    *(CharCount *)((long)&pPVar5[2].pageCount + sVar10 + 4) = CVar4;
    *(undefined4 *)((long)&pPVar5[2].segment + sVar10) = uVar2;
    Matcher::PushStats(matcher,contStack,input);
    pLVar16->startInputOffset = *inputOffset;
    iVar1 = *(int *)(lVar15 + 0x17 + uVar14);
    if (-1 < iVar1) {
      Matcher::DoSaveInnerGroups
                (matcher,*(int *)(lVar15 + 0x13 + uVar14),iVar1,true,input,contStack);
    }
    LVar3 = (this->super_RepeatLoopMixin).beginLabel;
    pPVar11 = (matcher->program).ptr;
  }
  if ((pPVar11->rep).insts.instsLen <= LVar3 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar7) {
LAB_00ef7e30:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
    pPVar11 = (matcher->program).ptr;
  }
  *instPointer = (pPVar11->rep).insts.insts.ptr + (LVar3 + 0x1c);
  return false;
}

Assistant:

inline bool RepeatLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopInst* begin = matcher.L2I(BeginLoop, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // See comment (****) above.
        if (begin->hasInnerNondet)
        {
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body.
            loopInfo->startInputOffset = inputOffset;
            if(begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else if (inputOffset == loopInfo->startInputOffset && loopInfo->number > begin->repeats.lower)
        {
            // The minimum number of iterations has been satisfied but the last iteration made no progress.
            //   - With greedy & deterministic body, FAIL so as to undo that iteration and restore group bindings.
            //   - With greedy & non-deterministic body, FAIL so as to try another body alternative
            //   - With non-greedy, we're trying an additional iteration because the follow failed. But
            //     since we didn't consume anything the follow will fail again, so fail
            //
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Success: proceed to remainder.
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else if (begin->isGreedy)
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack continue from here with no more iterations
            PUSH(contStack, ResumeCont, inputOffset, begin->exitLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            loopInfo->startInputOffset = inputOffset;

            // If backtrack, we must continue with previous group bindings
            matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else
        {
            // CHOICEPOINT: Try no more iterations of body, if backtrack do one more iteration of body from here
            PUSH(contStack, RepeatLoopCont, beginLabel, inputOffset);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        return false;
    }